

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

int __thiscall deqp::egl::ChooseConfigTests::init(ChooseConfigTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  ChooseConfigSimpleCase *pCVar3;
  ChooseConfigRandomCase *pCVar4;
  TestCaseGroup *pTVar5;
  ColorComponentTypeCase *pCVar6;
  uint (*arr) [4];
  uint (*arr_00) [6];
  uint (*arr_01) [5];
  uint (*arr_02) [2];
  uint (*arr_03) [2];
  uint (*arr_04) [24];
  DefaultDeleter<tcu::TestCaseGroup> local_1a9;
  undefined1 local_1a8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> colorComponentTypeGroup;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_190;
  undefined1 local_159;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_158;
  undefined1 local_121;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_120;
  undefined1 local_e9;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  undefined1 local_b1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_79;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_78;
  TestNode *local_48;
  TestCaseGroup *randomGroup;
  TestNode *pTStack_38;
  int ndx;
  TestCaseGroup *sortGroup;
  TestCaseGroup *selectionGroup;
  TestNode *local_18;
  TestCaseGroup *simpleGroup;
  ChooseConfigTests *this_local;
  
  simpleGroup = (TestCaseGroup *)this;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"simple",
             "Simple tests");
  local_18 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_only","Selection tests, order ignored");
  sortGroup = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild(local_18,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "selection_and_sort","Selection and ordering tests");
  pTStack_38 = pTVar2;
  tcu::TestNode::addChild(local_18,pTVar2);
  for (randomGroup._4_4_ = 0; pTVar5 = sortGroup, randomGroup._4_4_ < 0x1c;
      randomGroup._4_4_ = randomGroup._4_4_ + 1) {
    pCVar3 = (ChooseConfigSimpleCase *)operator_new(0xa8);
    ChooseConfigSimpleCase::ChooseConfigSimpleCase
              (pCVar3,(this->super_TestCaseGroup).m_eglTestCtx,
               init::attributes[randomGroup._4_4_].testName,"Simple config selection case",
               init::attributes[randomGroup._4_4_].attribute,false);
    tcu::TestNode::addChild(&pTVar5->super_TestNode,(TestNode *)pCVar3);
    pTVar2 = pTStack_38;
    pCVar3 = (ChooseConfigSimpleCase *)operator_new(0xa8);
    ChooseConfigSimpleCase::ChooseConfigSimpleCase
              (pCVar3,(this->super_TestCaseGroup).m_eglTestCtx,
               init::attributes[randomGroup._4_4_].testName,"Simple config selection and sort case",
               init::attributes[randomGroup._4_4_].attribute,true);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random eglChooseConfig() usage");
  local_48 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  local_79 = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,4ul>
            (&local_78,(_anonymous_namespace_ *)init::rgbaSizes,arr);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar4,pEVar1,"color_sizes","Random color size rules",&local_78);
  local_79 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_78);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  local_b1 = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,6ul>
            (&local_b0,(_anonymous_namespace_ *)init::colorDepthStencilSizes,arr_00);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar4,pEVar1,"color_depth_stencil_sizes","Random color, depth and stencil size rules",
             &local_b0);
  local_b1 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_b0);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  local_e9 = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,5ul>
            (&local_e8,(_anonymous_namespace_ *)init::bufferSizes,arr_01);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar4,pEVar1,"buffer_sizes","Various buffer size rules",&local_e8);
  local_e9 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_e8);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  local_121 = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            (&local_120,(_anonymous_namespace_ *)init::surfaceType,arr_02);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar4,pEVar1,"surface_type","Surface type rules",&local_120);
  local_121 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_120);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  local_159 = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
            (&local_158,(_anonymous_namespace_ *)init::sampleBuffers,arr_03);
  ChooseConfigRandomCase::ChooseConfigRandomCase
            (pCVar4,pEVar1,"sample_buffers","Sample buffer rules",&local_158);
  local_159 = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_158);
  pTVar2 = local_48;
  pCVar4 = (ChooseConfigRandomCase *)operator_new(0xd8);
  colorComponentTypeGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._15_1_ = 1;
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  egl::(anonymous_namespace)::toSet<unsigned_int,24ul>
            (&local_190,(_anonymous_namespace_ *)init::allAttribs,arr_04);
  ChooseConfigRandomCase::ChooseConfigRandomCase(pCVar4,pEVar1,"all","All attributes",&local_190);
  colorComponentTypeGroup.
  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._15_1_ = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar4);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_190);
  pTVar5 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "color_component_type_ext","EGL_EXT_pixel_format_float tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_1a9);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1a8,
             pTVar5);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_1a8)->super_TestNode;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"dont_care",0xffffffff);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar6);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_1a8)->super_TestNode;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"fixed",0x333a);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar6);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_1a8)->super_TestNode;
  pCVar6 = (ColorComponentTypeCase *)operator_new(0xa8);
  ColorComponentTypeCase::ColorComponentTypeCase
            (pCVar6,(this->super_TestCaseGroup).m_eglTestCtx,"float",0x333b);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar6);
  pTVar2 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_1a8)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1a8);
  return extraout_EAX;
}

Assistant:

void ChooseConfigTests::init (void)
{
	// Single attributes
	{
		static const struct
		{
			EGLenum			attribute;
			const char*		testName;
		} attributes[] =
		{
			{ EGL_BUFFER_SIZE,				"buffer_size"				},
			{ EGL_RED_SIZE,					"red_size"					},
			{ EGL_GREEN_SIZE,				"green_size"				},
			{ EGL_BLUE_SIZE,				"blue_size"					},
			{ EGL_LUMINANCE_SIZE,			"luminance_size"			},
			{ EGL_ALPHA_SIZE,				"alpha_size"				},
			{ EGL_ALPHA_MASK_SIZE,			"alpha_mask_size"			},
			{ EGL_BIND_TO_TEXTURE_RGB,		"bind_to_texture_rgb"		},
			{ EGL_BIND_TO_TEXTURE_RGBA,		"bind_to_texture_rgba"		},
			{ EGL_COLOR_BUFFER_TYPE,		"color_buffer_type"			},
			{ EGL_CONFIG_CAVEAT,			"config_caveat"				},
			{ EGL_CONFIG_ID,				"config_id"					},
			{ EGL_CONFORMANT,				"conformant"				},
			{ EGL_DEPTH_SIZE,				"depth_size"				},
			{ EGL_LEVEL,					"level"						},
			{ EGL_MAX_SWAP_INTERVAL,		"max_swap_interval"			},
			{ EGL_MIN_SWAP_INTERVAL,		"min_swap_interval"			},
			{ EGL_NATIVE_RENDERABLE,		"native_renderable"			},
			{ EGL_NATIVE_VISUAL_TYPE,		"native_visual_type"		},
			{ EGL_RENDERABLE_TYPE,			"renderable_type"			},
			{ EGL_SAMPLE_BUFFERS,			"sample_buffers"			},
			{ EGL_SAMPLES,					"samples"					},
			{ EGL_STENCIL_SIZE,				"stencil_size"				},
			{ EGL_SURFACE_TYPE,				"surface_type"				},
			{ EGL_TRANSPARENT_TYPE,			"transparent_type"			},
			{ EGL_TRANSPARENT_RED_VALUE,	"transparent_red_value"		},
			{ EGL_TRANSPARENT_GREEN_VALUE,	"transparent_green_value"	},
			{ EGL_TRANSPARENT_BLUE_VALUE,	"transparent_blue_value"	}
		};

		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "simple", "Simple tests");
		addChild(simpleGroup);

		tcu::TestCaseGroup* selectionGroup = new tcu::TestCaseGroup(m_testCtx, "selection_only", "Selection tests, order ignored");
		simpleGroup->addChild(selectionGroup);

		tcu::TestCaseGroup* sortGroup = new tcu::TestCaseGroup(m_testCtx, "selection_and_sort", "Selection and ordering tests");
		simpleGroup->addChild(sortGroup);

		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			selectionGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection case", attributes[ndx].attribute, false));
			sortGroup->addChild(new ChooseConfigSimpleCase(m_eglTestCtx, attributes[ndx].testName, "Simple config selection and sort case", attributes[ndx].attribute, true));
		}
	}

	// Random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random eglChooseConfig() usage");
		addChild(randomGroup);

		static const EGLenum rgbaSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_sizes", "Random color size rules", toSet(rgbaSizes)));

		static const EGLenum colorDepthStencilSizes[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "color_depth_stencil_sizes", "Random color, depth and stencil size rules", toSet(colorDepthStencilSizes)));

		static const EGLenum bufferSizes[] =
		{
			EGL_BUFFER_SIZE,
			EGL_LUMINANCE_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_DEPTH_SIZE,
			EGL_STENCIL_SIZE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "buffer_sizes", "Various buffer size rules", toSet(bufferSizes)));

		static const EGLenum surfaceType[] =
		{
			EGL_NATIVE_RENDERABLE,
			EGL_SURFACE_TYPE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "surface_type", "Surface type rules", toSet(surfaceType)));

		static const EGLenum sampleBuffers[] =
		{
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "sample_buffers", "Sample buffer rules", toSet(sampleBuffers)));

		// \note Not every attribute is supported at the moment
		static const EGLenum allAttribs[] =
		{
			EGL_BUFFER_SIZE,
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE,
			EGL_ALPHA_MASK_SIZE,
			EGL_BIND_TO_TEXTURE_RGB,
			EGL_BIND_TO_TEXTURE_RGBA,
			EGL_COLOR_BUFFER_TYPE,
			EGL_CONFIG_CAVEAT,
			EGL_CONFIG_ID,
			EGL_CONFORMANT,
			EGL_DEPTH_SIZE,
			EGL_LEVEL,
//			EGL_MATCH_NATIVE_PIXMAP,
			EGL_MAX_SWAP_INTERVAL,
			EGL_MIN_SWAP_INTERVAL,
			EGL_NATIVE_RENDERABLE,
			EGL_NATIVE_VISUAL_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SAMPLE_BUFFERS,
			EGL_SAMPLES,
			EGL_STENCIL_SIZE,
			EGL_SURFACE_TYPE,
			EGL_TRANSPARENT_TYPE,
//			EGL_TRANSPARENT_RED_VALUE,
//			EGL_TRANSPARENT_GREEN_VALUE,
//			EGL_TRANSPARENT_BLUE_VALUE
		};
		randomGroup->addChild(new ChooseConfigRandomCase(m_eglTestCtx, "all", "All attributes", toSet(allAttribs)));
	}

	// EGL_EXT_pixel_format_float
	{
		de::MovePtr<tcu::TestCaseGroup>	colorComponentTypeGroup	(new tcu::TestCaseGroup(m_testCtx, "color_component_type_ext", "EGL_EXT_pixel_format_float tests"));

		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "dont_care",	EGL_DONT_CARE));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "fixed",		EGL_COLOR_COMPONENT_TYPE_FIXED_EXT));
		colorComponentTypeGroup->addChild(new ColorComponentTypeCase(m_eglTestCtx, "float",		EGL_COLOR_COMPONENT_TYPE_FLOAT_EXT));

		addChild(colorComponentTypeGroup.release());
	}
}